

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_statistics.cpp
# Opt level: O2

bool duckdb::ParquetStatisticsUtils::BloomFilterExcludes
               (TableFilter *duckdb_filter,ColumnMetaData *column_meta_data,TProtocol *file_proto,
               Allocator *allocator)

{
  idx_t pos;
  bool bVar1;
  pointer pRVar2;
  Allocator *__nbytes;
  void *__buf;
  templated_unique_single_t new_buffer;
  ParquetBloomFilter bloom_filter;
  BloomFilterHeader filter_header;
  _Head_base<0UL,_duckdb::ResizeableBuffer_*,_false> local_a0;
  __uniq_ptr_impl<duckdb::ResizeableBuffer,_std::default_delete<duckdb::ResizeableBuffer>_> local_98
  ;
  ParquetBloomFilter local_90;
  undefined1 local_80 [32];
  _BloomFilterAlgorithm__isset local_60;
  _BloomFilterHash__isset local_48;
  _BloomFilterCompression__isset local_30;
  
  __nbytes = allocator;
  bVar1 = HasFilterConstants(duckdb_filter);
  if (((bVar1) && (((byte)column_meta_data->__isset & 0x20) != 0)) &&
     (0 < column_meta_data->bloom_filter_offset)) {
    ::std::__shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr((__shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
                  *)local_80,
                 &(file_proto->ptrans_).
                  super___shared_ptr<duckdb_apache::thrift::transport::TTransport,_(__gnu_cxx::_Lock_policy)2>
                );
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_80 + 8));
    pos = column_meta_data->bloom_filter_offset;
    *(idx_t *)(local_80._0_8_ + 0x10) = pos;
    if ((((byte)column_meta_data->__isset & 0x40) != 0) &&
       (0 < (long)column_meta_data->bloom_filter_length)) {
      ThriftFileTransport::Prefetch
                ((ThriftFileTransport *)local_80._0_8_,pos,
                 (long)column_meta_data->bloom_filter_length);
    }
    duckdb_parquet::BloomFilterHeader::BloomFilterHeader((BloomFilterHeader *)local_80);
    duckdb_parquet::BloomFilterHeader::read
              ((BloomFilterHeader *)local_80,(int)file_proto,__buf,(size_t)__nbytes);
    if (((((byte)local_60 & 1) == 0) || (((byte)local_30 & 1) == 0)) || (((byte)local_48 & 1) == 0))
    {
      bVar1 = false;
    }
    else {
      make_uniq<duckdb::ResizeableBuffer,duckdb::Allocator&,int&>
                ((duckdb *)&local_a0,allocator,(int *)(local_80 + 8));
      pRVar2 = unique_ptr<duckdb::ResizeableBuffer,_std::default_delete<duckdb::ResizeableBuffer>,_true>
               ::operator->((unique_ptr<duckdb::ResizeableBuffer,_std::default_delete<duckdb::ResizeableBuffer>,_true>
                             *)&local_a0);
      ThriftFileTransport::read
                ((ThriftFileTransport *)local_80._0_8_,(int)(pRVar2->super_ByteBuffer).ptr,
                 (void *)(ulong)(uint)local_80._8_4_,(size_t)__nbytes);
      local_98._M_t.
      super__Tuple_impl<0UL,_duckdb::ResizeableBuffer_*,_std::default_delete<duckdb::ResizeableBuffer>_>
      .super__Head_base<0UL,_duckdb::ResizeableBuffer_*,_false>._M_head_impl =
           (tuple<duckdb::ResizeableBuffer_*,_std::default_delete<duckdb::ResizeableBuffer>_>)
           (tuple<duckdb::ResizeableBuffer_*,_std::default_delete<duckdb::ResizeableBuffer>_>)
           local_a0._M_head_impl;
      local_a0._M_head_impl = (ResizeableBuffer *)0x0;
      ParquetBloomFilter::ParquetBloomFilter
                (&local_90,
                 (unique_ptr<duckdb::ResizeableBuffer,_std::default_delete<duckdb::ResizeableBuffer>,_true>
                  *)&local_98);
      ::std::unique_ptr<duckdb::ResizeableBuffer,_std::default_delete<duckdb::ResizeableBuffer>_>::
      ~unique_ptr((unique_ptr<duckdb::ResizeableBuffer,_std::default_delete<duckdb::ResizeableBuffer>_>
                   *)&local_98);
      bVar1 = ApplyBloomFilter(duckdb_filter,&local_90);
      ::std::unique_ptr<duckdb::ResizeableBuffer,_std::default_delete<duckdb::ResizeableBuffer>_>::
      ~unique_ptr((unique_ptr<duckdb::ResizeableBuffer,_std::default_delete<duckdb::ResizeableBuffer>_>
                   *)&local_90);
      ::std::unique_ptr<duckdb::ResizeableBuffer,_std::default_delete<duckdb::ResizeableBuffer>_>::
      ~unique_ptr((unique_ptr<duckdb::ResizeableBuffer,_std::default_delete<duckdb::ResizeableBuffer>_>
                   *)&local_a0);
    }
    duckdb_parquet::BloomFilterHeader::~BloomFilterHeader((BloomFilterHeader *)local_80);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ParquetStatisticsUtils::BloomFilterExcludes(const TableFilter &duckdb_filter,
                                                 const duckdb_parquet::ColumnMetaData &column_meta_data,
                                                 TProtocol &file_proto, Allocator &allocator) {
	if (!HasFilterConstants(duckdb_filter) || !column_meta_data.__isset.bloom_filter_offset ||
	    column_meta_data.bloom_filter_offset <= 0) {
		return false;
	}
	// TODO check length against file length!

	auto &transport = reinterpret_cast<ThriftFileTransport &>(*file_proto.getTransport());
	transport.SetLocation(column_meta_data.bloom_filter_offset);
	if (column_meta_data.__isset.bloom_filter_length && column_meta_data.bloom_filter_length > 0) {
		transport.Prefetch(column_meta_data.bloom_filter_offset, column_meta_data.bloom_filter_length);
	}

	duckdb_parquet::BloomFilterHeader filter_header;
	// TODO the bloom filter could be encrypted, too, so need to double check that this is NOT the case
	filter_header.read(&file_proto);
	if (!filter_header.algorithm.__isset.BLOCK || !filter_header.compression.__isset.UNCOMPRESSED ||
	    !filter_header.hash.__isset.XXHASH) {
		return false;
	}

	auto new_buffer = make_uniq<ResizeableBuffer>(allocator, filter_header.numBytes);
	transport.read(new_buffer->ptr, filter_header.numBytes);
	ParquetBloomFilter bloom_filter(std::move(new_buffer));
	return ApplyBloomFilter(duckdb_filter, bloom_filter);
}